

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryReader::BinaryRegistryReader
          (BinaryRegistryReader *this,Archive *archive,string *srcPath)

{
  this->m_archive = archive;
  std::__cxx11::string::string((string *)&this->m_srcPath,(string *)srcPath);
  (this->m_binaryIndex).
  super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
  .m_data.ptr = (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *)0x0;
  return;
}

Assistant:

BinaryRegistryReader::BinaryRegistryReader (const tcu::Archive& archive, const std::string& srcPath)
	: m_archive	(archive)
	, m_srcPath	(srcPath)
{
}